

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_17b0f4::ExprComparator::VisitCall(ExprComparator *this,CallExpr e)

{
  Kind KVar1;
  bool bVar2;
  int kind;
  int iVar3;
  ExprBase e2;
  ExprBase e1;
  ulong uVar4;
  Impl *pIVar5;
  Impl *pIVar6;
  
  pIVar6 = (this->expr_).super_ExprBase.impl_;
  pIVar5 = (Impl *)0x0;
  if (pIVar6->kind_ != CALL) {
    pIVar6 = pIVar5;
  }
  if (*(long *)(pIVar6 + 2) ==
      *(long *)((long)e.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase.impl_
               + 8)) {
    KVar1 = pIVar6[4].kind_;
    if (KVar1 == *(Kind *)((long)e.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                                 super_ExprBase.impl_ + 0x10)) {
      if ((int)KVar1 < 1) {
        pIVar5 = (Impl *)0x1;
      }
      else {
        uVar4 = 0;
        do {
          e1.impl_ = *(Impl **)&pIVar6[uVar4 * 2 + 6].kind_;
          e2.impl_ = ((ExprBase *)
                     ((long)e.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase
                            .impl_ + 0x18 + uVar4 * 8))->impl_;
          iVar3 = *(int *)e1.impl_;
          if (iVar3 != (e2.impl_)->kind_) goto LAB_00168a79;
          if (iVar3 - 0x30U < 0xffffffd1) {
            pIVar5 = (Impl *)0x0;
            if (iVar3 != 0x46) {
              e1.impl_ = (Impl *)0x0;
              e2.impl_ = (Impl *)0x0;
            }
            iVar3 = strcmp((char *)(e1.impl_ + 1),(char *)(e2.impl_ + 1));
            if (iVar3 != 0) goto LAB_00168a81;
          }
          else {
            bVar2 = mp::Equal((Expr)e1.impl_,(Expr)e2.impl_);
            if (!bVar2) goto LAB_00168a79;
          }
          uVar4 = uVar4 + 1;
        } while (KVar1 != uVar4);
        pIVar5 = (Impl *)(ulong)(KVar1 <= uVar4);
      }
    }
    else {
LAB_00168a79:
      pIVar5 = (Impl *)0x0;
    }
  }
LAB_00168a81:
  return SUB81(pIVar5,0);
}

Assistant:

bool ExprComparator::VisitCall(CallExpr e) {
  CallExpr call = Cast<CallExpr>(expr_);
  int num_args = call.num_args();
  if (call.function() != e.function() || num_args != e.num_args())
    return false;
  for (int i = 0; i < num_args; ++i) {
    Expr arg = call.arg(i), other_arg = e.arg(i);
    if (arg.kind() != other_arg.kind())
      return false;
    if (NumericExpr num_arg = Cast<NumericExpr>(arg)) {
      if (!Equal(num_arg, Cast<NumericExpr>(other_arg)))
        return false;
    } else if (std::strcmp(
            Cast<StringLiteral>(arg).value(),
            Cast<StringLiteral>(other_arg).value()) != 0)
      return false;
  }
  return true;
}